

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O1

double TasGrid::Optimizer::getDerivative<(TasGrid::TypeOneDRule)20>
                 (CurrentNodes<(TasGrid::TypeOneDRule)20> *current,double x)

{
  vector<double,_std::allocator<double>_> *coeffs;
  double dVar1;
  long lVar2;
  size_t inode;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> lag;
  vector<double,_std::allocator<double>_> lag_less1;
  vector<double,_std::allocator<double>_> local_68;
  pointer local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  coeffs = &current->coeff;
  evalLagrange(&local_68,&current->nodes,coeffs,x);
  evalLagrange(&local_48,&current->nodes_less1,&current->coeff_less1,x);
  if ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    dVar3 = 0.0;
  }
  else {
    lVar2 = (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_50 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    inode = 0;
    dVar3 = 0.0;
    do {
      dVar1 = local_50[inode];
      dVar6 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[inode];
      dVar4 = differentiateBasis(&current->nodes,coeffs,inode,x);
      dVar5 = differentiateBasis(&current->nodes_less1,&current->coeff_less1,inode,x);
      dVar3 = dVar3 + (dVar4 - dVar5) *
                      *(double *)(&DAT_001c9090 + (ulong)(0.0 <= dVar1 - dVar6) * 8);
      inode = inode + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != inode);
  }
  dVar1 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  dVar6 = differentiateBasis(&current->nodes,coeffs,
                             ((long)local_68.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_68.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) - 1,x);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar6 * *(double *)(&DAT_001c9090 + (ulong)(0.0 <= dVar1) * 8) + dVar3;
}

Assistant:

double getDerivative<rule_mindeltaodd>(CurrentNodes<rule_mindeltaodd> const& current, double x){
    auto lag       = evalLagrange(current.nodes,       current.coeff,       x);
    auto lag_less1 = evalLagrange(current.nodes_less1, current.coeff_less1, x);

    double sum = 0.0;
    for(size_t i=0; i<lag_less1.size(); i++){
        sum += Maths::sign(lag[i] - lag_less1[i])
                * (differentiateBasis(current.nodes,        current.coeff,       i, x)
                   - differentiateBasis(current.nodes_less1, current.coeff_less1, i, x));
    }
    return sum + Maths::sign(lag.back()) * differentiateBasis(current.nodes, current.coeff, lag.size() - 1, x);
}